

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool duckdb::HugeIntegerCastOperation::
     HandleDigit<duckdb::HugeIntCastData<duckdb::hugeint_t,duckdb::Hugeint,long>,true>
               (HugeIntCastData<duckdb::hugeint_t,_duckdb::Hugeint,_long> *state,uint8_t digit)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  undefined7 in_register_00000031;
  ulong uVar4;
  
  lVar3 = state->intermediate;
  uVar4 = CONCAT71(in_register_00000031,digit) & 0xffffffff;
  uVar2 = (0x8000000000000000 - uVar4) / 10;
  if (SBORROW8(lVar3,-uVar2) != (long)(lVar3 + uVar2) < 0) {
    bVar1 = HugeIntCastData<duckdb::hugeint_t,_duckdb::Hugeint,_long>::Flush(state);
    if (!bVar1) {
      return false;
    }
    lVar3 = state->intermediate;
  }
  state->intermediate = lVar3 * 10 - uVar4;
  state->digits = state->digits + '\x01';
  return true;
}

Assistant:

static bool HandleDigit(T &state, uint8_t digit) {
		if (NEGATIVE) {
			if (DUCKDB_UNLIKELY(state.intermediate <
			                    (NumericLimits<typename T::IntermediateType>::Minimum() + digit) / 10)) {
				// intermediate is full: need to flush it
				if (!state.Flush()) {
					return false;
				}
			}
			state.intermediate = state.intermediate * 10 - digit;
		} else {
			if (DUCKDB_UNLIKELY(state.intermediate >
			                    (NumericLimits<typename T::IntermediateType>::Maximum() - digit) / 10)) {
				if (!state.Flush()) {
					return false;
				}
			}
			state.intermediate = state.intermediate * 10 + digit;
		}
		state.digits++;
		return true;
	}